

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double IF97::BackwardOutputHS(IF97parameters outkey,double h,double s)

{
  IF97BACKREGIONS IVar1;
  int iVar2;
  out_of_range *this;
  code *pcVar3;
  undefined *puVar4;
  Region3bHS *this_00;
  double dVar5;
  
  if ((BackwardOutputHS(IF97parameters,double,double)::B1HS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B1HS), iVar2 != 0
     )) {
    Backwards::Region1HS::Region1HS(&BackwardOutputHS::B1HS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B1HS,&__dso_handle)
    ;
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B1HS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2aHS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2aHS),
     iVar2 != 0)) {
    Backwards::Region2aHS::Region2aHS(&BackwardOutputHS::B2aHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B2aHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2aHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2bHS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2bHS),
     iVar2 != 0)) {
    Backwards::Region2bHS::Region2bHS(&BackwardOutputHS::B2bHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B2bHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2bHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2cHS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2cHS),
     iVar2 != 0)) {
    Backwards::Region2cHS::Region2cHS(&BackwardOutputHS::B2cHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B2cHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2cHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B3aHS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B3aHS),
     iVar2 != 0)) {
    Backwards::Region3aHS::Region3aHS(&BackwardOutputHS::B3aHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B3aHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B3aHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B3bHS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B3bHS),
     iVar2 != 0)) {
    Backwards::Region3bHS::Region3bHS(&BackwardOutputHS::B3bHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B3bHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B3bHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B4HS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B4HS), iVar2 != 0
     )) {
    Backwards::Region4HS::Region4HS(&BackwardOutputHS::B4HS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B4HS,&__dso_handle)
    ;
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B4HS);
  }
  if (outkey - IF97_SMASS < 0xfffffffe) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"Backward HS Formulas output Temperature or Pressure only.")
    ;
    puVar4 = &std::invalid_argument::typeinfo;
    pcVar3 = std::invalid_argument::~invalid_argument;
    goto LAB_0011a707;
  }
  IVar1 = RegionDetermination_HS(h,s);
  switch(IVar1) {
  case BACK_1:
    this_00 = (Region3bHS *)&BackwardOutputHS::B1HS;
    break;
  case BACK_2A:
    this_00 = (Region3bHS *)&BackwardOutputHS::B2aHS;
    break;
  case BACK_2B:
    this_00 = (Region3bHS *)&BackwardOutputHS::B2bHS;
    break;
  case BACK_2C:
    this_00 = (Region3bHS *)&BackwardOutputHS::B2cHS;
    break;
  case BACK_3A:
    this_00 = (Region3bHS *)&BackwardOutputHS::B3aHS;
    break;
  case BACK_3B:
    this_00 = &BackwardOutputHS::B3bHS;
    break;
  case BACK_4:
    if (5.210887825 <= s) {
      dVar5 = Backwards::BackwardsRegion::t_hs(&BackwardOutputHS::B4HS.super_BackwardsRegion,h,s);
      if (outkey != IF97_P) {
        return dVar5;
      }
      dVar5 = psat97(dVar5);
      return dVar5;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Entropy out of range");
    goto LAB_0011a6f9;
  default:
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Unable to match region");
LAB_0011a6f9:
    puVar4 = &std::out_of_range::typeinfo;
    pcVar3 = std::out_of_range::~out_of_range;
LAB_0011a707:
    __cxa_throw(this,puVar4,pcVar3);
  }
  dVar5 = Backwards::BackwardsRegion::p_hs(&this_00->super_BackwardsRegion,h,s);
  if (outkey == IF97_P) {
    return dVar5;
  }
  dVar5 = RegionOutputBackward(dVar5,h,IF97_HMASS,false,NONE);
  return dVar5;
}

Assistant:

inline double BackwardOutputHS(IF97parameters outkey,double h, double s){
        // Note that this routine returns only temperature (IF97_T).  All other values should be
        // calculated from this temperature and the known pressure using forward equations.
        // Setup Backward Regions for output
        static Backwards::Region1HS B1HS;
        static Backwards::Region2aHS B2aHS;
        static Backwards::Region2bHS B2bHS;
        static Backwards::Region2cHS B2cHS;
        static Backwards::Region3aHS B3aHS;
        static Backwards::Region3bHS B3bHS;
        static Backwards::Region4HS B4HS;
        //
        double Pval, Tval;

        // Make sure output keys are valid for Backward_HS formulas
        if ((outkey != IF97_P) && (outkey != IF97_T))
            throw std::invalid_argument("Backward HS Formulas output Temperature or Pressure only.");

        // Get Saturation Parameters

        IF97BACKREGIONS region = RegionDetermination_HS(h, s);

        switch (region){
        case BACK_1:   Pval = B1HS.p_hs(h,s);  break;
        case BACK_2A:  Pval = B2aHS.p_hs(h,s); break;
        case BACK_2B:  Pval = B2bHS.p_hs(h,s); break;
        case BACK_2C:  Pval = B2cHS.p_hs(h,s); break;
        case BACK_3A:  Pval = B3aHS.p_hs(h,s); break;
        case BACK_3B:  Pval = B3bHS.p_hs(h,s); break;
        case BACK_4:   if (s >= SgT23)   // T(h,s) only defined over part of the 2-phase region
                           Tval = B4HS.t_hs(h,s);
                       else
                           throw std::out_of_range("Entropy out of range");
                       break;
        default: throw std::out_of_range("Unable to match region");
        }
        if (outkey == IF97_P)            // Returning Pressure (IF97_P)
            if (region == BACK_4)        //
                return psat97(Tval);     //       Not REGION 4, already have pressure
            else                         // 
                return Pval;             //       REGION 4, Calculate Psat from Tsat
                                         //
        else                             // ELSE Returning Temperature
            if (region == BACK_4)        //
                return Tval;                                     // REGION 4, already have Temperature
            else                                                 //
                return RegionOutputBackward(Pval,h,IF97_HMASS,false,NONE);  // Not REGION 4 Calc from Backward T(p,h)
    }